

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::convert_row_major_matrix
          (CompilerGLSL *this,string *exp_str,SPIRType *exp_type,uint32_t param_3,bool param_4,
          bool relaxed)

{
  bool relaxed_00;
  bool bVar1;
  long lVar2;
  long lVar3;
  CompilerError *this_00;
  undefined4 in_register_0000000c;
  SPIRType *type;
  byte in_stack_00000008;
  bool local_171;
  char *local_130;
  char local_122 [2];
  spirv_cross local_120 [36];
  uint local_fc;
  undefined1 local_f8 [4];
  uint32_t c;
  undefined1 local_d1;
  string local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  long local_70;
  size_type end_deferred_index;
  string local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> column_expr;
  size_type column_index;
  bool relaxed_local;
  bool param_4_local;
  uint32_t param_3_local;
  SPIRType *exp_type_local;
  string *exp_str_local;
  CompilerGLSL *this_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *transposed_expr;
  
  type = (SPIRType *)CONCAT44(in_register_0000000c,param_3);
  relaxed_00 = (bool)(in_stack_00000008 & 1);
  strip_enclosed_expression((CompilerGLSL *)exp_str,(string *)exp_type);
  bVar1 = Compiler::is_matrix((Compiler *)exp_str,type);
  if (bVar1) {
    if (*(uint *)(exp_str + 0x1dd4) < 0x78) {
      if ((type->vecsize == 2) && (type->columns == 2)) {
        require_polyfill((CompilerGLSL *)exp_str,PolyfillTranspose2x2,relaxed_00);
      }
      else if ((type->vecsize == 3) && (type->columns == 3)) {
        require_polyfill((CompilerGLSL *)exp_str,PolyfillTranspose3x3,relaxed_00);
      }
      else {
        if ((type->vecsize != 4) || (type->columns != 4)) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_00,
                     "Non-square matrices are not supported in legacy GLSL, cannot transpose.");
          __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        require_polyfill((CompilerGLSL *)exp_str,PolyfillTranspose4x4,relaxed_00);
      }
      local_171 = false;
      if (((byte)exp_str[0x1dd8] & 1) != 0) {
        local_171 = relaxed_00;
      }
      local_130 = "";
      if (local_171 != false) {
        local_130 = "MP";
      }
      join<char_const(&)[13],char_const*,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                ((spirv_cross *)this,(char (*) [13])0x40631c,&local_130,(char (*) [2])0x422b6e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)exp_type,
                 (char (*) [2])0x40bd22);
    }
    else {
      join<char_const(&)[11],std::__cxx11::string&,char_const(&)[2]>
                ((spirv_cross *)this,(char (*) [11])0x416c2e,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)exp_type,
                 (char (*) [2])0x40bd22);
    }
  }
  else {
    lVar2 = ::std::__cxx11::string::find_last_of((char)exp_type,0x5b);
    if (lVar2 == -1) {
      ::std::__cxx11::string::string((string *)this,(string *)exp_type);
    }
    else {
      ::std::__cxx11::string::substr((ulong)local_58,(ulong)exp_type);
      ::std::__cxx11::string::resize((ulong)exp_type);
      local_70 = ::std::__cxx11::string::find_last_of((char)local_58,0x5d);
      if ((local_70 != -1) &&
         (lVar2 = local_70 + 1, lVar3 = ::std::__cxx11::string::size(), lVar2 != lVar3)) {
        local_70 = local_70 + 1;
        ::std::__cxx11::string::substr((ulong)local_b0,(ulong)local_58);
        ::std::__cxx11::string::substr((ulong)local_d0,(ulong)local_58);
        ::std::operator+(local_90,local_b0);
        ::std::__cxx11::string::operator=(local_58,(string *)local_90);
        ::std::__cxx11::string::~string((string *)local_90);
        ::std::__cxx11::string::~string(local_d0);
        ::std::__cxx11::string::~string((string *)local_b0);
      }
      local_d1 = 0;
      type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_f8,(SPIRType *)exp_str);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       local_f8);
      ::std::__cxx11::string::~string((string *)local_f8);
      for (local_fc = 0; local_fc < type->vecsize; local_fc = local_fc + 1) {
        local_122[1] = 0x5b;
        local_122[0] = ']';
        join<std::__cxx11::string&,char,unsigned_int&,char,std::__cxx11::string&>
                  (local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)exp_type,
                   local_122 + 1,&local_fc,local_122,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
        ::std::__cxx11::string::operator+=((string *)this,(string *)local_120);
        ::std::__cxx11::string::~string((string *)local_120);
        if (local_fc + 1 < type->vecsize) {
          ::std::__cxx11::string::operator+=((string *)this,", ");
        }
      }
      ::std::__cxx11::string::operator+=((string *)this,")");
      local_d1 = 1;
      ::std::__cxx11::string::~string(local_58);
    }
  }
  return this;
}

Assistant:

string CompilerGLSL::convert_row_major_matrix(string exp_str, const SPIRType &exp_type, uint32_t /* physical_type_id */,
                                              bool /*is_packed*/, bool relaxed)
{
	strip_enclosed_expression(exp_str);
	if (!is_matrix(exp_type))
	{
		auto column_index = exp_str.find_last_of('[');
		if (column_index == string::npos)
			return exp_str;

		auto column_expr = exp_str.substr(column_index);
		exp_str.resize(column_index);

		auto end_deferred_index = column_expr.find_last_of(']');
		if (end_deferred_index != string::npos && end_deferred_index + 1 != column_expr.size())
		{
			// If we have any data member fixups, it must be transposed so that it refers to this index.
			// E.g. [0].data followed by [1] would be shuffled to [1][0].data which is wrong,
			// and needs to be [1].data[0] instead.
			end_deferred_index++;
			column_expr = column_expr.substr(end_deferred_index) +
			              column_expr.substr(0, end_deferred_index);
		}

		auto transposed_expr = type_to_glsl_constructor(exp_type) + "(";

		// Loading a column from a row-major matrix. Unroll the load.
		for (uint32_t c = 0; c < exp_type.vecsize; c++)
		{
			transposed_expr += join(exp_str, '[', c, ']', column_expr);
			if (c + 1 < exp_type.vecsize)
				transposed_expr += ", ";
		}

		transposed_expr += ")";
		return transposed_expr;
	}
	else if (options.version < 120)
	{
		// GLSL 110, ES 100 do not have transpose(), so emulate it.  Note that
		// these GLSL versions do not support non-square matrices.
		if (exp_type.vecsize == 2 && exp_type.columns == 2)
			require_polyfill(PolyfillTranspose2x2, relaxed);
		else if (exp_type.vecsize == 3 && exp_type.columns == 3)
			require_polyfill(PolyfillTranspose3x3, relaxed);
		else if (exp_type.vecsize == 4 && exp_type.columns == 4)
			require_polyfill(PolyfillTranspose4x4, relaxed);
		else
			SPIRV_CROSS_THROW("Non-square matrices are not supported in legacy GLSL, cannot transpose.");
		return join("spvTranspose", (options.es && relaxed) ? "MP" : "", "(", exp_str, ")");
	}
	else
		return join("transpose(", exp_str, ")");
}